

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O3

void Nwk_ManDfsReverse_rec(Nwk_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  Tim_Man_t *p;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  uint uVar3;
  void **ppvVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  iVar2 = pObj->pMan->nTravIds;
  if (pObj->TravId != iVar2) {
    pObj->TravId = iVar2;
    uVar5 = *(uint *)&pObj->field_0x20 & 7;
    if ((uVar5 == 1) || (uVar5 == 3)) {
      if (0 < pObj->nFanouts) {
        lVar8 = 0;
        do {
          if (pObj->pFanio[pObj->nFanins + lVar8] == (Nwk_Obj_t *)0x0) break;
          Nwk_ManDfsReverse_rec(pObj->pFanio[pObj->nFanins + lVar8],vNodes);
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < pObj->nFanouts);
      }
    }
    else {
      if (uVar5 != 2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                      ,0x1b4,"void Nwk_ManDfsReverse_rec(Nwk_Obj_t *, Vec_Ptr_t *)");
      }
      p = pObj->pMan->pManTime;
      if ((p != (Tim_Man_t *)0x0) &&
         (iVar2 = Tim_ManBoxForCo(p,*(uint *)&pObj->field_0x20 >> 7), -1 < iVar2)) {
        uVar5 = Tim_ManBoxOutputFirst(pObj->pMan->pManTime,iVar2);
        uVar3 = Tim_ManBoxOutputNum(pObj->pMan->pManTime,iVar2);
        if (0 < (int)uVar3) {
          uVar7 = (ulong)uVar5;
          uVar6 = (ulong)uVar3;
          do {
            if (((int)uVar5 < 0) || (pVVar1 = pObj->pMan->vCis, pVVar1->nSize <= (int)uVar7)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            Nwk_ManDfsReverse_rec((Nwk_Obj_t *)pVVar1->pArray[uVar7],vNodes);
            uVar7 = uVar7 + 1;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
      }
    }
    uVar5 = vNodes->nSize;
    if (uVar5 == vNodes->nCap) {
      if ((int)uVar5 < 0x10) {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
        }
        vNodes->pArray = ppvVar4;
        vNodes->nCap = 0x10;
      }
      else {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar5 << 4);
        }
        vNodes->pArray = ppvVar4;
        vNodes->nCap = uVar5 * 2;
      }
    }
    else {
      ppvVar4 = vNodes->pArray;
    }
    iVar2 = vNodes->nSize;
    vNodes->nSize = iVar2 + 1;
    ppvVar4[iVar2] = pObj;
  }
  return;
}

Assistant:

void Nwk_ManDfsReverse_rec( Nwk_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjIsCo(pObj) )
    {
        if ( pObj->pMan->pManTime )
        {
            iBox = Tim_ManBoxForCo( pObj->pMan->pManTime, pObj->PioId );
            if ( iBox >= 0 ) // this is not a true PO
            {
                iTerm1 = Tim_ManBoxOutputFirst( pObj->pMan->pManTime, iBox );
                nTerms = Tim_ManBoxOutputNum( pObj->pMan->pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Nwk_ManCi(pObj->pMan, iTerm1 + i);
                    Nwk_ManDfsReverse_rec( pNext, vNodes );
                }
            }
        }
    }
    else if ( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCi(pObj) )
    {
        Nwk_ObjForEachFanout( pObj, pNext, i )
            Nwk_ManDfsReverse_rec( pNext, vNodes );
    }
    else
        assert( 0 );
    Vec_PtrPush( vNodes, pObj );
}